

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

Object<cmCMakePresetsGraphInternal::InListCondition> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::InListCondition>::
Bind<cmCMakePresetsGraphInternal::InListCondition,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCMakePresetsGraphInternal::InListCondition> *this,string_view *name,
          offset_in_InListCondition_to_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          member,function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraphInternal::InListCondition> *pOVar1;
  MemberFunction local_70;
  anon_class_40_2_315d8239 local_50;
  
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function(&local_50.func,func);
  local_50.member = member;
  std::function<bool(cmCMakePresetsGraphInternal::InListCondition&,Json::Value_const*,cmJSONState*)>
  ::
  function<cmJSONHelperBuilder::Object<cmCMakePresetsGraphInternal::InListCondition>::Bind<cmCMakePresetsGraphInternal::InListCondition,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>cmCMakePresetsGraphInternal::InListCondition::*,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)>,bool)::_lambda(cmCMakePresetsGraphInternal::InListCondition&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(cmCMakePresetsGraphInternal::InListCondition&,Json::Value_const*,cmJSONState*)>
              *)&local_70,&local_50);
  pOVar1 = BindPrivate(this,name,&local_70,required);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }